

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool vkb::detail::GenericFeaturesPNextNode::match
               (GenericFeaturesPNextNode *requested,GenericFeaturesPNextNode *supported)

{
  uint32_t i;
  ulong uVar1;
  
  if (requested->sType == supported->sType) {
    for (uVar1 = 0;
        (uVar1 != 0x100 && ((requested->fields[uVar1] == 0 || (supported->fields[uVar1] != 0))));
        uVar1 = uVar1 + 1) {
    }
    return 0xff < uVar1;
  }
  __assert_fail("requested.sType == supported.sType && \"Non-matching sTypes in features nodes!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                ,0x31,
                "static bool vkb::detail::GenericFeaturesPNextNode::match(const GenericFeaturesPNextNode &, const GenericFeaturesPNextNode &)"
               );
}

Assistant:

bool GenericFeaturesPNextNode::match(GenericFeaturesPNextNode const& requested, GenericFeaturesPNextNode const& supported) noexcept {
    assert(requested.sType == supported.sType && "Non-matching sTypes in features nodes!");
    for (uint32_t i = 0; i < field_capacity; i++) {
        if (requested.fields[i] && !supported.fields[i]) return false;
    }
    return true;
}